

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# grammar.cpp
# Opt level: O3

vector<strong_t<int,_grammar::token_tag>,_std::allocator<strong_t<int,_grammar::token_tag>_>_> *
__thiscall
grammar::cyclic_path
          (vector<strong_t<int,_grammar::token_tag>,_std::allocator<strong_t<int,_grammar::token_tag>_>_>
           *__return_storage_ptr__,grammar *this)

{
  pointer psVar1;
  iterator __position;
  void *pvVar2;
  mapped_type *pmVar3;
  size_type sVar4;
  undefined8 uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  key_type *pkVar9;
  long lVar10;
  key_type *pkVar11;
  key_type *__k;
  size_t start_symbol;
  key_type *local_a8;
  key_type *pkStack_a0;
  long local_98;
  vector<strong_t<int,grammar::token_tag>,std::allocator<strong_t<int,grammar::token_tag>>>
  *local_90;
  unsigned_long local_88;
  strong_t<int,_grammar::token_tag> local_7c;
  _Rb_tree<strong_t<int,_grammar::token_tag>,_strong_t<int,_grammar::token_tag>,_std::_Identity<strong_t<int,_grammar::token_tag>_>,_std::less<strong_t<int,_grammar::token_tag>_>,_std::allocator<strong_t<int,_grammar::token_tag>_>_>
  local_78;
  grammar *local_40;
  map<strong_t<int,_grammar::token_tag>,_std::vector<strong_t<int,_grammar::token_tag>,_std::allocator<strong_t<int,_grammar::token_tag>_>_>,_std::less<strong_t<int,_grammar::token_tag>_>,_std::allocator<std::pair<const_strong_t<int,_grammar::token_tag>,_std::vector<strong_t<int,_grammar::token_tag>,_std::allocator<strong_t<int,_grammar::token_tag>_>_>_>_>_>
  *local_38;
  
  local_a8 = (key_type *)0x0;
  pkStack_a0 = (key_type *)0x0;
  local_98 = 0;
  local_88 = 1;
  if (1 < (this->rules)._M_t._M_impl.super__Rb_tree_header._M_node_count) {
    local_38 = &this->rules;
    local_90 = (vector<strong_t<int,grammar::token_tag>,std::allocator<strong_t<int,grammar::token_tag>>>
                *)__return_storage_ptr__;
    local_40 = this;
    do {
      if (local_a8 == pkStack_a0) {
        local_78._M_impl._0_4_ = 0xffffffff;
        std::
        vector<std::pair<strong_t<int,grammar::token_tag>,unsigned_long>,std::allocator<std::pair<strong_t<int,grammar::token_tag>,unsigned_long>>>
        ::emplace_back<unsigned_long&,int>
                  ((vector<std::pair<strong_t<int,grammar::token_tag>,unsigned_long>,std::allocator<std::pair<strong_t<int,grammar::token_tag>,unsigned_long>>>
                    *)&local_a8,&local_88,(int *)&local_78);
        local_88 = local_88 + 1;
      }
      __k = pkStack_a0 + -4;
      pmVar3 = std::
               map<strong_t<int,_grammar::token_tag>,_std::vector<strong_t<int,_grammar::token_tag>,_std::allocator<strong_t<int,_grammar::token_tag>_>_>,_std::less<strong_t<int,_grammar::token_tag>_>,_std::allocator<std::pair<const_strong_t<int,_grammar::token_tag>,_std::vector<strong_t<int,_grammar::token_tag>,_std::allocator<strong_t<int,_grammar::token_tag>_>_>_>_>_>
               ::at(local_38,__k);
      lVar10 = (long)pkStack_a0 - (long)local_a8;
      uVar7 = *(long *)(pkStack_a0 + -2) + 1;
      pkVar11 = local_a8;
      pkVar9 = pkStack_a0;
      do {
        psVar1 = (pmVar3->
                 super__Vector_base<strong_t<int,_grammar::token_tag>,_std::allocator<strong_t<int,_grammar::token_tag>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        uVar6 = (long)(pmVar3->
                      super__Vector_base<strong_t<int,_grammar::token_tag>,_std::allocator<strong_t<int,_grammar::token_tag>_>_>
                      )._M_impl.super__Vector_impl_data._M_finish - (long)psVar1 >> 2;
        uVar8 = uVar7;
        if (uVar7 < uVar6) {
          if (((psVar1[uVar7].internal_rep < 1) || (psVar1[uVar7].internal_rep == __k->internal_rep)
              ) || ((uVar7 != 0 && ((psVar1 + uVar7)[-1].internal_rep != 0)))) {
LAB_001053db:
            do {
              uVar8 = uVar7;
              if (psVar1[uVar7].internal_rep == 0) break;
              uVar7 = uVar7 + 1;
              uVar8 = uVar6;
            } while (uVar6 != uVar7);
            goto LAB_001053ec;
          }
          if (uVar7 != uVar6 - 1) {
            if (uVar6 <= uVar7 + 1) {
              uVar5 = std::__throw_out_of_range_fmt
                                ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                                 ,uVar7 + 1);
              pvVar2 = *(void **)local_90;
              if (pvVar2 != (void *)0x0) {
                operator_delete(pvVar2,(long)*(pointer *)(local_90 + 0x10) - (long)pvVar2);
              }
              std::
              _Rb_tree<strong_t<int,_grammar::token_tag>,_strong_t<int,_grammar::token_tag>,_std::_Identity<strong_t<int,_grammar::token_tag>_>,_std::less<strong_t<int,_grammar::token_tag>_>,_std::allocator<strong_t<int,_grammar::token_tag>_>_>
              ::~_Rb_tree(&local_78);
              if (local_a8 != (key_type *)0x0) {
                operator_delete(local_a8,local_98 - (long)local_a8);
              }
              _Unwind_Resume(uVar5);
            }
            if (psVar1[uVar7 + 1].internal_rep != 0) goto LAB_001053db;
          }
          *(ulong *)(pkVar9 + -2) = uVar7;
          local_78._M_impl._0_4_ = 0xffffffff;
          std::
          vector<std::pair<strong_t<int,grammar::token_tag>,unsigned_long>,std::allocator<std::pair<strong_t<int,grammar::token_tag>,unsigned_long>>>
          ::emplace_back<strong_t<int,grammar::token_tag>const&,int>
                    ((vector<std::pair<strong_t<int,grammar::token_tag>,unsigned_long>,std::allocator<std::pair<strong_t<int,grammar::token_tag>,unsigned_long>>>
                      *)&local_a8,psVar1 + uVar7,(int *)&local_78);
          pkVar11 = local_a8;
          pkVar9 = pkStack_a0;
        }
        else {
LAB_001053ec:
          uVar7 = uVar8 + 1;
          if (uVar6 <= uVar7) {
            pkStack_a0 = pkVar9 + -4;
            pkVar9 = pkStack_a0;
          }
        }
        __return_storage_ptr__ =
             (vector<strong_t<int,_grammar::token_tag>,_std::allocator<strong_t<int,_grammar::token_tag>_>_>
              *)local_90;
      } while ((long)pkVar9 - (long)pkVar11 == lVar10);
      local_78._M_impl._0_8_ = 0;
      local_78._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      local_78._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
      local_78._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      local_78._M_impl.super__Rb_tree_header._M_header._M_left =
           &local_78._M_impl.super__Rb_tree_header._M_header;
      local_78._M_impl.super__Rb_tree_header._M_node_count = 0;
      local_78._M_impl.super__Rb_tree_header._M_header._M_right =
           local_78._M_impl.super__Rb_tree_header._M_header._M_left;
      for (; pkVar11 != pkVar9; pkVar11 = pkVar11 + 4) {
        sVar4 = std::
                set<strong_t<int,_grammar::token_tag>,_std::less<strong_t<int,_grammar::token_tag>_>,_std::allocator<strong_t<int,_grammar::token_tag>_>_>
                ::count((set<strong_t<int,_grammar::token_tag>,_std::less<strong_t<int,_grammar::token_tag>_>,_std::allocator<strong_t<int,_grammar::token_tag>_>_>
                         *)&local_78,pkVar11);
        if (sVar4 != 0) {
          *(undefined8 *)__return_storage_ptr__ = 0;
          *(undefined8 *)((long)__return_storage_ptr__ + 8) = 0;
          *(undefined8 *)((long)__return_storage_ptr__ + 0x10) = 0;
          std::
          vector<strong_t<int,_grammar::token_tag>,_std::allocator<strong_t<int,_grammar::token_tag>_>_>
          ::reserve(__return_storage_ptr__,(long)pkStack_a0 - (long)local_a8 >> 4);
          pkVar11 = pkStack_a0;
          if (local_a8 != pkStack_a0) {
            pkVar9 = local_a8;
            do {
              local_7c.internal_rep = pkVar9->internal_rep;
              __position._M_current =
                   *(strong_t<int,_grammar::token_tag> **)((long)__return_storage_ptr__ + 8);
              if (__position._M_current ==
                  *(strong_t<int,_grammar::token_tag> **)((long)__return_storage_ptr__ + 0x10)) {
                std::
                vector<strong_t<int,grammar::token_tag>,std::allocator<strong_t<int,grammar::token_tag>>>
                ::_M_realloc_insert<strong_t<int,grammar::token_tag>>
                          ((vector<strong_t<int,grammar::token_tag>,std::allocator<strong_t<int,grammar::token_tag>>>
                            *)__return_storage_ptr__,__position,&local_7c);
              }
              else {
                (__position._M_current)->internal_rep = local_7c.internal_rep;
                *(strong_t<int,_grammar::token_tag> **)((long)__return_storage_ptr__ + 8) =
                     __position._M_current + 1;
              }
              pkVar9 = pkVar9 + 4;
            } while (pkVar9 != pkVar11);
          }
          std::
          _Rb_tree<strong_t<int,_grammar::token_tag>,_strong_t<int,_grammar::token_tag>,_std::_Identity<strong_t<int,_grammar::token_tag>_>,_std::less<strong_t<int,_grammar::token_tag>_>,_std::allocator<strong_t<int,_grammar::token_tag>_>_>
          ::~_Rb_tree(&local_78);
          goto LAB_00105529;
        }
        std::
        _Rb_tree<strong_t<int,grammar::token_tag>,strong_t<int,grammar::token_tag>,std::_Identity<strong_t<int,grammar::token_tag>>,std::less<strong_t<int,grammar::token_tag>>,std::allocator<strong_t<int,grammar::token_tag>>>
        ::_M_insert_unique<strong_t<int,grammar::token_tag>const&>
                  ((_Rb_tree<strong_t<int,grammar::token_tag>,strong_t<int,grammar::token_tag>,std::_Identity<strong_t<int,grammar::token_tag>>,std::less<strong_t<int,grammar::token_tag>>,std::allocator<strong_t<int,grammar::token_tag>>>
                    *)&local_78,pkVar11);
      }
      std::
      _Rb_tree<strong_t<int,_grammar::token_tag>,_strong_t<int,_grammar::token_tag>,_std::_Identity<strong_t<int,_grammar::token_tag>_>,_std::less<strong_t<int,_grammar::token_tag>_>,_std::allocator<strong_t<int,_grammar::token_tag>_>_>
      ::~_Rb_tree(&local_78);
    } while (local_88 < (local_40->rules)._M_t._M_impl.super__Rb_tree_header._M_node_count);
  }
  *(undefined8 *)__return_storage_ptr__ = 0;
  *(pointer *)((long)__return_storage_ptr__ + 8) = (pointer)0x0;
  *(pointer *)((long)__return_storage_ptr__ + 0x10) = (pointer)0x0;
LAB_00105529:
  if (local_a8 != (key_type *)0x0) {
    operator_delete(local_a8,local_98 - (long)local_a8);
  }
  return (vector<strong_t<int,_grammar::token_tag>,_std::allocator<strong_t<int,_grammar::token_tag>_>_>
          *)(vector<strong_t<int,grammar::token_tag>,std::allocator<strong_t<int,grammar::token_tag>>>
             *)__return_storage_ptr__;
}

Assistant:

std::vector<token_t> grammar::cyclic_path() const {
    // Path so far
    std::vector<std::pair<token_t /*token*/, size_t /*option*/>> path{};

    size_t start_symbol = 1;

    while (start_symbol < nonterminal_count()) {
        // Pick start point
        if (path.empty()) {
            path.emplace_back(start_symbol, -1);
            start_symbol++;
        }

        // Read the options of the path and which option to chose
        const auto & current_symbol = path.back().first;
        const auto & options        = rules.at(current_symbol);
        auto         rule_used      = path.back().second + 1;

        const auto old_path_length = path.size();
        while (path.size() == old_path_length) {
            if (rule_used < options.size()
                and options.at(rule_used) > 0
                // the rule used is pointing at a nonterminal
                and options.at(rule_used) != current_symbol
                // the rule is not generating the same symbol
                and (rule_used == 0 /*there is nothing to the left of us*/
                     or options.at(rule_used - 1) == rule_sep
                     /*the left is a rule separator*/)
                and (rule_used == options.size() - 1
                     or options.at(rule_used + 1) == rule_sep)) {
                // found a valid rule to use
                path.back().second = rule_used;
                path.emplace_back(options.at(rule_used), -1);
            } else {
                // move to the next valid rule
                while (rule_used < options.size()
                       and options.at(rule_used) != rule_sep)
                    rule_used++;
                rule_used++;
                if (rule_used >= options.size()) {
                    // used all options -> go back
                    path.pop_back();
                }
            }
        }

        // Check the path for repeats
        std::set<token_t> seen_nonterminals{};
        for (const auto & entry : path)
            if (seen_nonterminals.count(entry.first) != 0) {
                std::vector<token_t> to_ret;
                to_ret.reserve(path.size());
                std::transform(path.begin(), path.end(),
                               std::back_inserter(to_ret),
                               [](const auto & entry) { return entry.first; });
                return to_ret;
            } else
                seen_nonterminals.insert(entry.first);
    }

    return {};
}